

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_wave_multi_prefix_op
          (Impl *this,SPIRVModule *module,Op opcode,Id type_id)

{
  initializer_list<unsigned_int> __l;
  bool bVar1;
  Id IVar2;
  Id IVar3;
  Id id;
  Id IVar4;
  char *name;
  Function *this_00;
  Block *this_01;
  Block *this_02;
  Block *this_03;
  Block *this_04;
  Block *this_05;
  __uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true> this_06;
  pointer pIVar5;
  pointer pIVar6;
  size_t sVar7;
  Block *pBVar8;
  value_type local_1ec;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1e0;
  undefined4 local_1d8;
  Id local_1d4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1d0;
  __single_object phi_1;
  Id local_1bc;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1b8;
  __single_object phi;
  Id local_1a4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1a0;
  __single_object prefix_op;
  Id result_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_188;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_180;
  undefined4 local_178;
  Id local_174;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_170;
  __single_object compare_reduce;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_160;
  __single_object compare;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_150;
  __single_object broadcast_first;
  Id compare_reduce_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_138;
  undefined4 local_130;
  Id local_12c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_128;
  __single_object mask_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_118;
  __single_object ballot_op;
  Block *inner_entry_block;
  Block *continue_block;
  Block *prefix_block;
  Block *merge_block;
  Block *body_block;
  Block *header_block;
  Block *return_block;
  Block *outer_entry;
  Id undef_value;
  Id mask_id;
  Id value_id;
  Function *local_a8;
  Function *func;
  Id local_98;
  Id local_94;
  iterator local_90;
  undefined8 local_88;
  undefined1 local_80 [8];
  Vector<spv::Id> types;
  Id bvec4_type;
  Id bool_type;
  Id uvec4_type;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  MultiPrefixOp *call;
  iterator __end1;
  iterator __begin1;
  Vector<MultiPrefixOp> *__range1;
  Id type_id_local;
  Op opcode_local;
  SPIRVModule *module_local;
  Impl *this_local;
  
  __range1._0_4_ = type_id;
  __range1._4_4_ = opcode;
  _type_id_local = module;
  module_local = (SPIRVModule *)this;
  __end1 = std::
           vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
           ::begin(&this->wave_multi_prefix_call_ids);
  call = (MultiPrefixOp *)
         std::
         vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
         ::end(&this->wave_multi_prefix_call_ids);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>_>
                                *)&call);
    if (!bVar1) {
      entry = spv::Builder::getBuildPoint(&this->builder);
      _uvec4_type = (Instruction *)0x0;
      bool_type = spv::Builder::makeUintType(&this->builder,0x20);
      bvec4_type = spv::Builder::makeVectorType(&this->builder,bool_type,4);
      types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = spv::Builder::makeBoolType(&this->builder);
      types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           spv::Builder::makeVectorType
                     (&this->builder,
                      types.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
      local_98 = (Id)__range1;
      local_94 = bvec4_type;
      local_90 = &local_98;
      local_88 = 2;
      __l._M_len = 2;
      __l._M_array = local_90;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80,__l
                 ,(allocator_type *)((long)&func + 7));
      if ((this->helper_lanes_participate_in_wave_ops & 1U) == 0) {
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80,
                   (value_type_conflict1 *)
                   ((long)&types.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      IVar2 = (Id)__range1;
      name = opcode_to_multi_prefix_name(__range1._4_4_);
      memset(&mask_id,0,0x18);
      std::
      vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                *)&mask_id);
      this_00 = spv::Builder::makeFunctionEntry
                          (&this->builder,DecorationMax,IVar2,name,(Vector<Id> *)local_80,
                           (Vector<dxil_spv::Vector<Decoration>_> *)&mask_id,(Block **)&uvec4_type);
      std::
      vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 *)&mask_id);
      local_a8 = this_00;
      IVar2 = spv::Function::getParamId(this_00,0);
      IVar3 = spv::Function::getParamId(local_a8,1);
      sVar7 = (size_t)(Id)__range1;
      id = spv::Builder::createUndefined(&this->builder,(Id)__range1);
      return_block = (Block *)0x0;
      header_block = (Block *)0x0;
      this_01 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
      IVar4 = spv::Builder::getUniqueId(&this->builder);
      sVar7 = (size_t)IVar4;
      spv::Block::Block(this_01,IVar4,local_a8);
      this_02 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
      IVar4 = spv::Builder::getUniqueId(&this->builder);
      sVar7 = (size_t)IVar4;
      spv::Block::Block(this_02,IVar4,local_a8);
      this_03 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
      IVar4 = spv::Builder::getUniqueId(&this->builder);
      sVar7 = (size_t)IVar4;
      spv::Block::Block(this_03,IVar4,local_a8);
      this_04 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
      IVar4 = spv::Builder::getUniqueId(&this->builder);
      sVar7 = (size_t)IVar4;
      spv::Block::Block(this_04,IVar4,local_a8);
      this_05 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
      IVar4 = spv::Builder::getUniqueId(&this->builder);
      spv::Block::Block(this_05,IVar4,local_a8);
      pBVar8 = (Block *)_uvec4_type;
      spv::Builder::setBuildPoint(&this->builder,(Block *)_uvec4_type);
      if ((this->helper_lanes_participate_in_wave_ops & 1U) == 0) {
        header_block = (Block *)spv::Block::operator_new((Block *)0x78,(size_t)pBVar8);
        IVar4 = spv::Builder::getUniqueId(&this->builder);
        sVar7 = (size_t)IVar4;
        spv::Block::Block(header_block,IVar4,local_a8);
        this_06.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
        .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
             (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
             spv::Block::operator_new((Block *)0x78,sVar7);
        IVar4 = spv::Builder::getUniqueId(&this->builder);
        spv::Block::Block((Block *)this_06.
                                   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
                          IVar4,local_a8);
        ballot_op._M_t.
        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
             (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
             (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
             this_06.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
        spv::Builder::createSelectionMerge(&this->builder,header_block,0);
        IVar4 = spv::Function::getParamId(local_a8,2);
        spv::Builder::createConditionalBranch
                  (&this->builder,IVar4,header_block,
                   (Block *)ballot_op._M_t.
                            super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
        return_block = (Block *)_uvec4_type;
        _uvec4_type = (Instruction *)
                      ballot_op._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
        spv::Builder::setBuildPoint
                  (&this->builder,
                   (Block *)ballot_op._M_t.
                            super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      }
      mask_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      mask_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x153;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_118,
                 (uint *)((long)&mask_op._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,&bvec4_type);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_118);
      IVar4 = spv::Builder::makeUintConstant(&this->builder,3,false);
      spv::Instruction::addIdOperand(pIVar5,IVar4);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_118);
      IVar4 = spv::Builder::makeBoolConstant(&this->builder,true,false);
      spv::Instruction::addIdOperand(pIVar5,IVar4);
      local_12c = spv::Builder::getUniqueId(&this->builder);
      local_130 = 199;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_128,&local_12c,&bvec4_type);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_128);
      pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_118);
      IVar4 = spv::Instruction::getResultId(pIVar6);
      spv::Instruction::addIdOperand(pIVar5,IVar4);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_128);
      spv::Instruction::addIdOperand(pIVar5,IVar3);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_128);
      IVar3 = spv::Instruction::getResultId(pIVar5);
      pBVar8 = (Block *)_uvec4_type;
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_138,&local_118);
      add_instruction(this,pBVar8,&local_138);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_138);
      pBVar8 = (Block *)_uvec4_type;
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffec0,&local_128);
      add_instruction(this,pBVar8,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &stack0xfffffffffffffec0);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffec0);
      spv::Builder::createBranch(&this->builder,this_01);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_128);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_118);
      spv::Builder::setBuildPoint(&this->builder,this_01);
      spv::Builder::createLoopMerge(&this->builder,this_03,this_02,0);
      spv::Builder::createBranch(&this->builder,this_02);
      spv::Builder::setBuildPoint(&this->builder,this_02);
      compare._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      compare._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x152;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_150,
                 (uint *)((long)&compare._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,&bvec4_type);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_150);
      IVar4 = spv::Builder::makeUintConstant(&this->builder,3,false);
      spv::Instruction::addIdOperand(pIVar5,IVar4);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_150);
      spv::Instruction::addIdOperand(pIVar5,IVar3);
      compare_reduce._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      compare_reduce._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xaa;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_160,
                 (uint *)((long)&compare_reduce._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,(Op *)&types.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_160);
      spv::Instruction::addIdOperand(pIVar5,IVar3);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_160);
      pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_150);
      IVar3 = spv::Instruction::getResultId(pIVar6);
      spv::Instruction::addIdOperand(pIVar5,IVar3);
      local_174 = spv::Builder::getUniqueId(&this->builder);
      local_178 = 0x9b;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_170,&local_174,
                 (Op *)((long)&types.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_170);
      pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_160);
      IVar3 = spv::Instruction::getResultId(pIVar6);
      spv::Instruction::addIdOperand(pIVar5,IVar3);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_170);
      broadcast_first._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Instruction::getResultId(pIVar5);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_180,&local_150);
      add_instruction(this,this_02,&local_180);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_180);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_188,&local_160);
      add_instruction(this,this_02,&local_188);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_188);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffe70,&local_170);
      add_instruction(this,this_02,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &stack0xfffffffffffffe70);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffe70);
      spv::Builder::createSelectionMerge(&this->builder,this_05,0);
      spv::Builder::createConditionalBranch
                (&this->builder,
                 broadcast_first._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_,this_04,this_05
                );
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_170);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_160);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_150);
      spv::Builder::setBuildPoint(&this->builder,this_04);
      local_1a4 = spv::Builder::getUniqueId(&this->builder);
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op&>
                ((uint *)&local_1a0,&local_1a4,(Op *)&__range1);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1a0);
      IVar3 = spv::Builder::makeUintConstant(&this->builder,3,false);
      spv::Instruction::addIdOperand(pIVar5,IVar3);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1a0);
      spv::Instruction::addImmediateOperand(pIVar5,2);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1a0);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1a0);
      prefix_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
      ._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Instruction::getResultId(pIVar5);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&phi,&local_1a0);
      add_instruction(this,this_04,&phi);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&phi);
      spv::Builder::createBranch(&this->builder,this_05);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_1a0);
      spv::Builder::setBuildPoint(&this->builder,this_05);
      local_1bc = spv::Builder::getUniqueId(&this->builder);
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_1b8,&local_1bc,(Op *)&__range1);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1b8);
      spv::Instruction::addIdOperand
                (pIVar5,prefix_op._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1b8);
      IVar2 = spv::Block::getId(this_04);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1b8);
      spv::Instruction::addIdOperand(pIVar5,id);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1b8);
      IVar2 = spv::Block::getId(this_02);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_1b8);
      prefix_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
      ._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Instruction::getResultId(pIVar5);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&phi_1,&local_1b8);
      add_instruction(this,this_05,&phi_1);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&phi_1)
      ;
      spv::Builder::createConditionalBranch
                (&this->builder,
                 broadcast_first._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_,this_03,this_01
                );
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_1b8);
      spv::Builder::setBuildPoint(&this->builder,this_03);
      if (header_block != (Block *)0x0) {
        spv::Builder::createBranch(&this->builder,header_block);
        spv::Builder::setBuildPoint(&this->builder,header_block);
        local_1d4 = spv::Builder::getUniqueId(&this->builder);
        local_1d8 = 0xf5;
        std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                  ((uint *)&local_1d0,&local_1d4,(Op *)&__range1);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_1d0);
        spv::Instruction::addIdOperand
                  (pIVar5,prefix_op._M_t.
                          super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_1d0);
        IVar2 = spv::Block::getId(this_03);
        spv::Instruction::addIdOperand(pIVar5,IVar2);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_1d0);
        spv::Instruction::addIdOperand(pIVar5,id);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_1d0);
        IVar2 = spv::Block::getId(return_block);
        spv::Instruction::addIdOperand(pIVar5,IVar2);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_1d0);
        prefix_op._M_t.
        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
             spv::Instruction::getResultId(pIVar5);
        std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                  (&local_1e0,&local_1d0);
        add_instruction(this,header_block,&local_1e0);
        std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                  (&local_1e0);
        std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                  (&local_1d0);
      }
      spv::Builder::makeReturn
                (&this->builder,false,
                 prefix_op._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
      spv::Builder::setBuildPoint(&this->builder,entry);
      spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
      spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformArithmetic);
      local_1ec.opcode = __range1._4_4_;
      local_1ec.type_id = (Id)__range1;
      local_1ec.func_id = spv::Function::getId(local_a8);
      std::
      vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
      ::push_back(&this->wave_multi_prefix_call_ids,&local_1ec);
      this_local._4_4_ = spv::Function::getId(local_a8);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80);
      return this_local._4_4_;
    }
    current_build_point =
         (Block *)__gnu_cxx::
                  __normal_iterator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>_>
                  ::operator*(&__end1);
    if ((*(Op *)&current_build_point->_vptr_Block == __range1._4_4_) &&
       (*(Id *)((long)&current_build_point->_vptr_Block + 4) == (Id)__range1)) break;
    __gnu_cxx::
    __normal_iterator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>_>
    ::operator++(&__end1);
  }
  return *(Id *)&(current_build_point->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

spv::Id SPIRVModule::Impl::build_wave_multi_prefix_op(SPIRVModule &module, spv::Op opcode, spv::Id type_id)
{
	for (auto &call : wave_multi_prefix_call_ids)
		if (call.opcode == opcode && call.type_id == type_id)
			return call.func_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();
	spv::Id bvec4_type = builder.makeVectorType(bool_type, 4);

	Vector<spv::Id> types = { type_id, uvec4_type };
	if (!helper_lanes_participate_in_wave_ops)
		types.push_back(bool_type);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, type_id,
	                                       opcode_to_multi_prefix_name(opcode),
	                                       types, {}, &entry);
	spv::Id value_id = func->getParamId(0);
	spv::Id mask_id = func->getParamId(1);
	spv::Id undef_value = builder.createUndefined(type_id);

	spv::Block *outer_entry = nullptr;
	spv::Block *return_block = nullptr;
	auto *header_block = new spv::Block(builder.getUniqueId(), *func);
	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *prefix_block = new spv::Block(builder.getUniqueId(), *func);
	auto *continue_block = new spv::Block(builder.getUniqueId(), *func);

	builder.setBuildPoint(entry);

	if (!helper_lanes_participate_in_wave_ops)
	{
		return_block = new spv::Block(builder.getUniqueId(), *func);
		auto *inner_entry_block = new spv::Block(builder.getUniqueId(), *func);

		builder.createSelectionMerge(return_block, 0);
		builder.createConditionalBranch(func->getParamId(2), return_block, inner_entry_block);
		outer_entry = entry;
		entry = inner_entry_block;
		builder.setBuildPoint(entry);
	}

	{
		auto ballot_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
		ballot_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		ballot_op->addIdOperand(builder.makeBoolConstant(true));
		auto mask_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseAnd);
		mask_op->addIdOperand(ballot_op->getResultId());
		mask_op->addIdOperand(mask_id);
		mask_id = mask_op->getResultId();
		add_instruction(entry, std::move(ballot_op));
		add_instruction(entry, std::move(mask_op));
		builder.createBranch(header_block);
	}

	builder.setBuildPoint(header_block);
	{
		builder.createLoopMerge(merge_block, body_block, 0);
		builder.createBranch(body_block);
	}

	builder.setBuildPoint(body_block);
	spv::Id compare_reduce_id;
	{
		auto broadcast_first = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBroadcastFirst);
		broadcast_first->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		broadcast_first->addIdOperand(mask_id);

		auto compare = std::make_unique<spv::Instruction>(builder.getUniqueId(), bvec4_type, spv::OpIEqual);
		compare->addIdOperand(mask_id);
		compare->addIdOperand(broadcast_first->getResultId());

		auto compare_reduce = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpAll);
		compare_reduce->addIdOperand(compare->getResultId());
		compare_reduce_id = compare_reduce->getResultId();

		add_instruction(body_block, std::move(broadcast_first));
		add_instruction(body_block, std::move(compare));
		add_instruction(body_block, std::move(compare_reduce));
		builder.createSelectionMerge(continue_block, 0);
		builder.createConditionalBranch(compare_reduce_id, prefix_block, continue_block);
	}

	spv::Id result_id;
	builder.setBuildPoint(prefix_block);
	{
		auto prefix_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, opcode);
		prefix_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		prefix_op->addImmediateOperand(spv::GroupOperationExclusiveScan);
		prefix_op->addIdOperand(value_id);
		result_id = prefix_op->getResultId();
		add_instruction(prefix_block, std::move(prefix_op));
		builder.createBranch(continue_block);
	}

	builder.setBuildPoint(continue_block);
	{
		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpPhi);
		phi->addIdOperand(result_id);
		phi->addIdOperand(prefix_block->getId());
		phi->addIdOperand(undef_value);
		phi->addIdOperand(body_block->getId());
		result_id = phi->getResultId();
		add_instruction(continue_block, std::move(phi));
		builder.createConditionalBranch(compare_reduce_id, merge_block, header_block);
	}

	builder.setBuildPoint(merge_block);

	if (return_block)
	{
		builder.createBranch(return_block);
		builder.setBuildPoint(return_block);

		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpPhi);
		phi->addIdOperand(result_id);
		phi->addIdOperand(merge_block->getId());
		phi->addIdOperand(undef_value);
		phi->addIdOperand(outer_entry->getId());
		result_id = phi->getResultId();
		add_instruction(return_block, std::move(phi));
	}

	builder.makeReturn(false, result_id);

	builder.setBuildPoint(current_build_point);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	wave_multi_prefix_call_ids.push_back({ opcode, type_id, func->getId() });
	return func->getId();
}